

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::count128_lcg_shift>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  ostream *poVar1;
  char *pcVar2;
  unsigned_long uVar3;
  result_type rVar4;
  result_type rVar5;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  count128_lcg_shift r;
  count128_lcg_shift *this;
  result_type in_stack_ffffffffffffff68;
  ulong local_70;
  
  P.increment.value._8_8_ = DAT_0011d1a0;
  P.increment.value._0_8_ = DAT_0011d198;
  P.a = (result_type)DAT_0011d1a8;
  P.b = in_stack_ffffffffffffff68;
  uVar3 = DAT_0011d198;
  this = DAT_0011d1a8;
  trng::count128_lcg_shift::count128_lcg_shift((count128_lcg_shift *)0x10da92,P);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"# generator ");
  pcVar2 = trng::count128_lcg_shift::name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"  seed = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"type: d\n");
  poVar1 = std::operator<<(poVar1,"count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"numbit: ");
  trng::count128_lcg_shift::max();
  trng::count128_lcg_shift::min();
  uVar3 = trng::int_math::log2_ceil<unsigned_long>(uVar3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  std::operator<<(poVar1,'\n');
  for (local_70 = 0; local_70 < in_RDI; local_70 = local_70 + 1) {
    rVar4 = trng::count128_lcg_shift::operator()(this);
    rVar5 = trng::count128_lcg_shift::min();
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar4 - rVar5);
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}